

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

Abc_Cex_t * Gia_ManAreDeriveCex(Gia_ManAre_t *p,Gia_StaAre_t *pLast)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  Gia_StaAre_t *pCur;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *pGVar6;
  Vec_Int_t *pVVar7;
  uint *__ptr;
  void *pvVar8;
  Abc_Cex_t *pAVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  Gia_StaAre_t *pGVar13;
  uint uVar14;
  long lVar15;
  
  if (p->iOutFail < 0) {
    __assert_fail("p->iOutFail >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                  ,0x785,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
  }
  Gia_ManAreDeriveCexSatStart(p);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar8 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar8;
  pGVar13 = pLast;
  if ((Gia_StaAre_t *)*p->ppStas != pLast) {
    do {
      if (pGVar13 != pLast) {
        uVar1 = __ptr[1];
        uVar2 = *__ptr;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar14 = 0x10;
          }
          else {
            uVar14 = uVar2 * 2;
            if ((int)uVar14 <= (int)uVar2) goto LAB_006cff91;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar2 << 4);
            }
            else {
              pvVar8 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = uVar14;
        }
LAB_006cff91:
        __ptr[1] = uVar1 + 1;
        *(Gia_StaAre_t **)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = pGVar13;
      }
      pGVar13 = (Gia_StaAre_t *)
                ((long)p->nSize * (ulong)((uint)pGVar13->iPrev & 0xfffff) * 4 +
                *(long *)((long)p->ppStas + (ulong)((uint)pGVar13->iPrev >> 0x11 & 0x3ff8)));
    } while ((Gia_StaAre_t *)*p->ppStas != pGVar13);
  }
  uVar1 = __ptr[1];
  if ((long)(int)uVar1 < 1) {
    __assert_fail("Vec_PtrSize(vStates) >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                  ,0x78c,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
  }
  iVar10 = p->pAig->nRegs;
  pAVar9 = Abc_CexAlloc(iVar10,p->pAig->vCis->nSize - iVar10,uVar1);
  pAVar9->iFrame = uVar1 - 1;
  pAVar9->iPo = p->iOutFail;
  lVar3 = *(long *)(__ptr + 2);
  lVar15 = 0;
  pGVar13 = (Gia_StaAre_t *)0x0;
  do {
    iVar10 = -1;
    if (lVar15 == 0) {
      iVar10 = p->iOutFail;
    }
    pCur = *(Gia_StaAre_t **)(lVar3 + lVar15 * 8);
    Gia_ManAreDeriveCexSat(p,pCur,pGVar13,iVar10);
    pVVar4 = p->vCofVars;
    if (0 < pVVar4->nSize) {
      piVar5 = pVVar4->pArray;
      pGVar6 = p->pAig;
      pVVar7 = pGVar6->vCis;
      lVar11 = 0;
      do {
        iVar10 = pGVar6->nRegs;
        iVar12 = pVVar7->nSize - iVar10;
        if (iVar12 <= piVar5[lVar11]) {
          __assert_fail("Var < Gia_ManPiNum(p->pAig)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                        ,0x79a,"Abc_Cex_t *Gia_ManAreDeriveCex(Gia_ManAre_t *, Gia_StaAre_t *)");
        }
        iVar10 = iVar10 + piVar5[lVar11] + iVar12 * (~(uint)lVar15 + uVar1);
        (&pAVar9[1].iPo)[iVar10 >> 5] = (&pAVar9[1].iPo)[iVar10 >> 5] | 1 << ((byte)iVar10 & 0x1f);
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar4->nSize);
    }
    lVar15 = lVar15 + 1;
    pGVar13 = pCur;
  } while (lVar15 != (int)uVar1);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  Gia_ManAreDeriveCexSatStop(p);
  return pAVar9;
}

Assistant:

Abc_Cex_t * Gia_ManAreDeriveCex( Gia_ManAre_t * p, Gia_StaAre_t * pLast )
{
    Abc_Cex_t * pCex;
    Vec_Ptr_t * vStates;
    Gia_StaAre_t * pSta, * pPrev;
    int Var, i, v;
    assert( p->iOutFail >= 0 );
    Gia_ManAreDeriveCexSatStart( p );
    // compute the trace
    vStates = Vec_PtrAlloc( 1000 );
    for ( pSta = pLast; Gia_StaIsGood(p, pSta); pSta = Gia_StaPrev(p, pSta) )
        if ( pSta != pLast )
            Vec_PtrPush( vStates, pSta );
    assert( Vec_PtrSize(vStates) >= 1 );
    // start the counter-example
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pAig), Gia_ManPiNum(p->pAig), Vec_PtrSize(vStates) );
    pCex->iFrame = Vec_PtrSize(vStates)-1;
    pCex->iPo = p->iOutFail;
    // compute states
    pPrev = NULL;
    Vec_PtrForEachEntry( Gia_StaAre_t *, vStates, pSta, i )
    {
        Gia_ManAreDeriveCexSat( p, pSta, pPrev, (i == 0) ? p->iOutFail : -1 ); 
        pPrev = pSta;
        // create the counter-example
        Vec_IntForEachEntry( p->vCofVars, Var, v )
        {
            assert( Var < Gia_ManPiNum(p->pAig) );
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p->pAig) + (Vec_PtrSize(vStates)-1-i) * Gia_ManPiNum(p->pAig) + Var );
        }
    }
    // free temporary things
    Vec_PtrFree( vStates );
    Gia_ManAreDeriveCexSatStop( p );
    return pCex;
}